

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

bool __thiscall Am_Value::operator!=(Am_Value *this,Am_Value *test_value)

{
  ushort uVar1;
  Am_Wrapper *pAVar2;
  int iVar3;
  bool bVar4;
  
  uVar1 = this->type;
  if ((uVar1 & 0x7000) == 0x1000 || uVar1 != test_value->type) {
    return true;
  }
  if ((short)uVar1 < 0) {
    pAVar2 = (this->value).wrapper_value;
    if (pAVar2 != (test_value->value).wrapper_value) {
      if ((test_value->value).wrapper_value == (Am_Wrapper *)0x0 || pAVar2 == (Am_Wrapper *)0x0) {
        return true;
      }
      iVar3 = (*(pAVar2->super_Am_Registered_Type)._vptr_Am_Registered_Type[6])();
      if ((char)iVar3 == '\0') {
        return true;
      }
      if (-1 < (short)this->type) goto LAB_0022bda3;
    }
    bVar4 = false;
  }
  else {
LAB_0022bda3:
    bVar4 = (this->value).wrapper_value != (test_value->value).wrapper_value;
  }
  return bVar4;
}

Assistant:

bool
Am_Value::operator!=(const Am_Value &test_value) const
{
  return type != test_value.type ||
         Am_Type_Class(type) == Am_ERROR_VALUE_TYPE ||
         (Am_Type_Is_Ref_Counted(type) &&
          value.wrapper_value != test_value.value.wrapper_value &&
          (!value.wrapper_value || !test_value.value.wrapper_value ||
           !(*value.wrapper_value == *test_value.value.wrapper_value))) ||
         (!Am_Type_Is_Ref_Counted(type) &&
          value.voidptr_value != test_value.value.voidptr_value);
}